

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

bool __thiscall
vkt::api::anon_unknown_0::CompareEachPixelInEachRegion::forEach
          (CompareEachPixelInEachRegion *this,void *pUserData,
          vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          *regions,int sourceWidth,int sourceHeight,PixelBufferAccess *errorMask)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint x;
  VkImageBlit *blit;
  pointer pCVar5;
  int iVar6;
  uint y;
  Vec2 srcNormCoord;
  Vec4 local_40;
  
  pCVar5 = (regions->
           super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar5 == (regions->
                super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    do {
      iVar3 = (pCVar5->imageBlit).dstOffsets[1].x - (pCVar5->imageCopy).extent.width;
      iVar1 = iVar3 >> 0x1f;
      if (0 < iVar3) {
        iVar1 = 1;
      }
      iVar3 = (pCVar5->imageBlit).dstOffsets[1].y;
      y = (pCVar5->imageBlit).dstOffsets[0].y;
      iVar4 = iVar3 - y;
      iVar6 = iVar4 >> 0x1f;
      if (0 < iVar4) {
        iVar6 = 1;
      }
      if ((int)y < iVar3) {
        do {
          for (x = (pCVar5->imageBlit).dstOffsets[0].x; (int)x < (pCVar5->imageBlit).dstOffsets[1].x
              ; x = x + iVar1) {
            iVar3 = (*this->_vptr_CompareEachPixelInEachRegion[2])(this,pUserData,(ulong)x,(ulong)y)
            ;
            if ((char)iVar3 == '\0') {
              local_40.m_data[0] = 1.0;
              local_40.m_data[1] = 0.0;
              local_40.m_data[2] = 0.0;
              local_40.m_data[3] = 1.0;
              bVar2 = false;
              tcu::PixelBufferAccess::setPixel(errorMask,&local_40,x,y,0);
            }
          }
          y = y + iVar6;
        } while ((int)y < (pCVar5->imageBlit).dstOffsets[1].y);
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != (regions->
                       super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar2;
}

Assistant:

bool forEach (const void*						pUserData,
				  const std::vector<CopyRegion>&	regions,
				  const int							sourceWidth,
				  const int							sourceHeight,
				  const tcu::PixelBufferAccess&		errorMask) const
	{
		bool compareOk = true;

		for (std::vector<CopyRegion>::const_iterator regionIter = regions.begin(); regionIter != regions.end(); ++regionIter)
		{
			const VkImageBlit& blit = regionIter->imageBlit;

			const int	dx		= deSign32(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const int	dy		= deSign32(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float	xScale	= static_cast<float>(blit.srcOffsets[1].x - blit.srcOffsets[0].x) / static_cast<float>(blit.dstOffsets[1].x - blit.dstOffsets[0].x);
			const float	yScale	= static_cast<float>(blit.srcOffsets[1].y - blit.srcOffsets[0].y) / static_cast<float>(blit.dstOffsets[1].y - blit.dstOffsets[0].y);
			const float srcInvW	= 1.0f / static_cast<float>(sourceWidth);
			const float srcInvH	= 1.0f / static_cast<float>(sourceHeight);

			for (int y = blit.dstOffsets[0].y; y < blit.dstOffsets[1].y; y += dy)
			for (int x = blit.dstOffsets[0].x; x < blit.dstOffsets[1].x; x += dx)
			{
				const tcu::Vec2 srcNormCoord
				(
					(xScale * (static_cast<float>(x - blit.dstOffsets[0].x) + 0.5f) + static_cast<float>(blit.srcOffsets[0].x)) * srcInvW,
					(yScale * (static_cast<float>(y - blit.dstOffsets[0].y) + 0.5f) + static_cast<float>(blit.srcOffsets[0].y)) * srcInvH
				);

				if (!compare(pUserData, x, y, srcNormCoord))
				{
					errorMask.setPixel(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y);
					compareOk = false;
				}
			}
		}
		return compareOk;
	}